

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

size_t __thiscall bidfx_public_api::tools::ByteBuffer::WriteLong(ByteBuffer *this,int64_t value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  uchar bytes [8];
  uint64_t i;
  int64_t value_local;
  ByteBuffer *this_local;
  
  local_28 = (undefined1)((ulong)value >> 0x38);
  local_27 = (undefined1)((ulong)value >> 0x30);
  local_26 = (undefined1)((ulong)value >> 0x28);
  local_25 = (undefined1)((ulong)value >> 0x20);
  local_24 = (undefined1)((ulong)value >> 0x18);
  local_23 = (undefined1)((ulong)value >> 0x10);
  local_22 = (undefined1)((ulong)value >> 8);
  local_21 = (undefined1)value;
  bytes = (uchar  [8])value;
  iVar1 = (*(this->super_InputStream)._vptr_InputStream[3])(this,&local_28,8);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t ByteBuffer::WriteLong(const int64_t value)
{
    uint64_t i = *(uint64_t*)&value;
    unsigned char bytes[8];
    bytes[0] = (unsigned char) (i >> 56);
    bytes[1] = (unsigned char) (i >> 48);
    bytes[2] = (unsigned char) (i >> 40);
    bytes[3] = (unsigned char) (i >> 32);
    bytes[4] = (unsigned char) (i >> 24);
    bytes[5] = (unsigned char) (i >> 16);
    bytes[6] = (unsigned char) (i >> 8);
    bytes[7] = (unsigned char) i;
    return WriteBytes(bytes, 8);
}